

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# licensecc.cpp
# Opt level: O1

LCC_EVENT_TYPE
acquire_license(CallerInformations *callerInformation,LicenseLocation *licenseLocation,
               LicenseInfo *license_out)

{
  char *szptr;
  FUNCTION_RETURN FVar1;
  uint uVar2;
  size_t sVar3;
  AuditEvent_conflict *pAVar4;
  anon_struct_6488_8_6b9767e4 **ppaVar5;
  LCC_EVENT_TYPE LVar6;
  anon_struct_6488_8_6b9767e4 *paVar7;
  iterator __position;
  vector<LicenseInfo,std::allocator<LicenseInfo>> *this;
  anon_struct_6488_8_6b9767e4 *__src;
  pointer licInfo;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  vector<LicenseInfo,_std::allocator<LicenseInfo>_> licenses_with_errors;
  vector<LicenseInfo,_std::allocator<LicenseInfo>_> licenses_ok;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenses;
  string project;
  LicenseVerifier verifier;
  LicenseReader lr;
  EventRegistry er;
  string evlog;
  anon_struct_6488_8_6b9767e4 *local_1a78;
  anon_struct_6488_8_6b9767e4 *paStack_1a70;
  anon_struct_6488_8_6b9767e4 *local_1a68;
  anon_struct_6488_8_6b9767e4 *local_1a58;
  anon_struct_6488_8_6b9767e4 *paStack_1a50;
  anon_struct_6488_8_6b9767e4 *local_1a48;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> local_1a38;
  LicenseInfo *local_1a20;
  undefined1 *local_1a18;
  long local_1a10;
  undefined1 local_1a08 [16];
  LicenseVerifier local_19f8;
  LicenseReader local_19e8;
  EventRegistry local_19d8;
  LicenseInfo local_1988;
  
  license::LicenseReader::LicenseReader(&local_19e8,licenseLocation);
  local_1a38.super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a38.super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (FullLicenseInfo *)0x0;
  local_1a38.super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (FullLicenseInfo *)0x0;
  local_1a18 = local_1a08;
  local_1a10 = 0;
  local_1a08[0] = 0;
  if (callerInformation == (CallerInformations *)0x0) {
LAB_00187306:
    local_1988.status[0]._0_8_ = (long)&local_1988 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1988,"DEFAULT","");
  }
  else {
    szptr = callerInformation->feature_name;
    sVar3 = license::mstrnlen_s(szptr,0x10);
    if (sVar3 == 0) goto LAB_00187306;
    local_1988.status[0]._0_8_ = (long)&local_1988 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1988,szptr,szptr + sVar3);
  }
  std::__cxx11::string::operator=((string *)&local_1a18,(string *)&local_1988);
  if ((undefined1 *)local_1988.status[0]._0_8_ != (undefined1 *)((long)&local_1988 + 0x10U)) {
    operator_delete((void *)local_1988.status[0]._0_8_);
  }
  local_1988.status[0]._0_8_ = (undefined1 *)((long)&local_1988 + 0x10U);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1988,local_1a18,local_1a18 + local_1a10);
  license::LicenseReader::readLicenses(&local_19d8,&local_19e8,(string *)&local_1988,&local_1a38);
  if ((undefined1 *)local_1988.status[0]._0_8_ != (undefined1 *)((long)&local_1988 + 0x10U)) {
    operator_delete((void *)local_1988.status[0]._0_8_);
  }
  if (local_1a38.
      super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_1a38.
      super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    license::EventRegistry::turnWarningsIntoErrors(&local_19d8);
    pAVar4 = license::EventRegistry::getLastFailure(&local_19d8);
    LVar6 = pAVar4->event_type;
    if (license_out != (LicenseInfo *)0x0) {
      license_out->proprietary_data[0] = '\0';
      license_out->linked_to_pc = false;
      license_out->days_left = 0;
    }
    goto LAB_0018763d;
  }
  local_1a78 = (anon_struct_6488_8_6b9767e4 *)0x0;
  paStack_1a70 = (anon_struct_6488_8_6b9767e4 *)0x0;
  local_1a68 = (anon_struct_6488_8_6b9767e4 *)0x0;
  local_1a48 = (anon_struct_6488_8_6b9767e4 *)0x0;
  local_1a58 = (anon_struct_6488_8_6b9767e4 *)0x0;
  paStack_1a50 = (anon_struct_6488_8_6b9767e4 *)0x0;
  local_1a20 = license_out;
  license::LicenseVerifier::LicenseVerifier(&local_19f8,&local_19d8);
  if (local_1a38.
      super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_1a38.
      super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    licInfo = local_1a38.
              super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (callerInformation != (CallerInformations *)0x0) {
        licInfo->m_magic = callerInformation->magic;
      }
      FVar1 = license::LicenseVerifier::verify_signature(&local_19f8,licInfo);
      license::LicenseVerifier::toLicenseInfo(&local_1988,&local_19f8,licInfo);
      if ((FVar1 == FUNC_RET_OK) &&
         (FVar1 = license::LicenseVerifier::verify_limits(&local_19f8,licInfo), FVar1 == FUNC_RET_OK
         )) {
        this = (vector<LicenseInfo,std::allocator<LicenseInfo>> *)&local_1a58;
        ppaVar5 = &paStack_1a50;
        __position._M_current = paStack_1a50;
        paVar7 = paStack_1a50;
        if (paStack_1a50 != local_1a48) goto LAB_0018745a;
LAB_0018748c:
        std::vector<LicenseInfo,std::allocator<LicenseInfo>>::_M_realloc_insert<LicenseInfo_const&>
                  (this,__position,(anon_struct_6488_8_6b9767e4 *)&local_1988);
      }
      else {
        ppaVar5 = &paStack_1a70;
        __position._M_current = paStack_1a70;
        paVar7 = paStack_1a70;
        this = (vector<LicenseInfo,std::allocator<LicenseInfo>> *)&local_1a78;
        if (paStack_1a70 == local_1a68) goto LAB_0018748c;
LAB_0018745a:
        memcpy(paVar7,&local_1988,0x1958);
        *ppaVar5 = paVar7 + 1;
      }
      licInfo = licInfo + 1;
    } while (licInfo !=
             local_1a38.
             super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (paStack_1a50 == local_1a58) {
    license::EventRegistry::turnWarningsIntoErrors(&local_19d8);
    license_out = local_1a20;
    pAVar4 = license::EventRegistry::getLastFailure(&local_19d8);
    paVar7 = paStack_1a70;
    LVar6 = pAVar4->event_type;
    if ((license_out != (LicenseInfo *)0x0) && (local_1a78 != paStack_1a70)) {
      uVar2 = 0x80000000;
      __src = local_1a78;
      do {
        if (__src->has_expiry != true) goto LAB_00187603;
        if ((int)uVar2 < (int)__src->days_left) {
          memcpy(license_out,__src,0x1958);
          uVar2 = __src->days_left;
        }
        __src = __src + 1;
      } while (__src != paVar7);
    }
  }
  else {
    license::EventRegistry::turnErrorsIntoWarnings(&local_19d8);
    license_out = local_1a20;
    paVar7 = paStack_1a50;
    LVar6 = LICENSE_OK;
    if ((local_1a20 != (LicenseInfo *)0x0) && (LVar6 = LICENSE_OK, local_1a58 != paStack_1a50)) {
      uVar2 = 0x80000000;
      __src = local_1a58;
LAB_001874fb:
      if (__src->has_expiry == true) goto code_r0x00187509;
      LVar6 = LICENSE_OK;
LAB_00187603:
      memcpy(license_out,__src,0x1958);
    }
  }
  goto LAB_00187613;
code_r0x00187509:
  if ((int)uVar2 < (int)__src->days_left) {
    memcpy(license_out,__src,0x1958);
    uVar2 = __src->days_left;
  }
  __src = __src + 1;
  if (__src == paVar7) goto code_r0x00187535;
  goto LAB_001874fb;
code_r0x00187535:
  LVar6 = LICENSE_OK;
LAB_00187613:
  license::LicenseVerifier::~LicenseVerifier(&local_19f8);
  if (local_1a58 != (anon_struct_6488_8_6b9767e4 *)0x0) {
    operator_delete(local_1a58);
  }
  if (local_1a78 != (anon_struct_6488_8_6b9767e4 *)0x0) {
    operator_delete(local_1a78);
  }
LAB_0018763d:
  license::EventRegistry::to_string_abi_cxx11_((string *)&local_1988,&local_19d8);
  _log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  if (license_out != (LicenseInfo *)0x0) {
    license::EventRegistry::exportLastEvents(&local_19d8,(AuditEvent_conflict *)license_out,5);
  }
  if ((undefined1 *)local_1988.status[0]._0_8_ != (undefined1 *)((long)&local_1988 + 0x10U)) {
    operator_delete((void *)local_1988.status[0]._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&local_19d8.mostAdvancedLogIdx_by_LicenseId._M_t);
  if (local_19d8.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer_conflict)0x0) {
    operator_delete(local_19d8.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1a18 != local_1a08) {
    operator_delete(local_1a18);
  }
  std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
            (&local_1a38);
  license::LicenseReader::~LicenseReader(&local_19e8);
  return LVar6;
}

Assistant:

LCC_EVENT_TYPE acquire_license(const CallerInformations* callerInformation, const LicenseLocation* licenseLocation,
							   LicenseInfo* license_out) {
	const license::LicenseReader lr = license::LicenseReader(licenseLocation);
	vector<license::FullLicenseInfo> licenses;
	string project;
	size_t str_size;
	if (callerInformation != nullptr &&
		(str_size = license::mstrnlen_s(callerInformation->feature_name, sizeof callerInformation->feature_name)) > 0) {
		project = string(callerInformation->feature_name, str_size);
	} else {
		project = string(LCC_PROJECT_NAME);
	}
	license::EventRegistry er = lr.readLicenses(string(project), licenses);
	LCC_EVENT_TYPE result;
	if (licenses.size() > 0) {
		vector<LicenseInfo> licenses_with_errors;
		vector<LicenseInfo> licenses_ok;
		license::LicenseVerifier verifier(er);
		for (auto full_lic_info_it = licenses.begin(); full_lic_info_it != licenses.end(); full_lic_info_it++) {
			if (callerInformation != nullptr) {
				full_lic_info_it->m_magic = callerInformation->magic;
			}
			const FUNCTION_RETURN signatureValid = verifier.verify_signature(*full_lic_info_it);
			LicenseInfo licInfo = verifier.toLicenseInfo(*full_lic_info_it);
			if (signatureValid == FUNC_RET_OK) {
				if (verifier.verify_limits(*full_lic_info_it) == FUNC_RET_OK) {
					licenses_ok.push_back(licInfo);
				} else {
					licenses_with_errors.push_back(licInfo);
				}
			} else {
				licenses_with_errors.push_back(licInfo);
			}
		}
		if (licenses_ok.size() > 0) {
			er.turnErrorsIntoWarnings();
			result = LICENSE_OK;
			mergeLicenses(licenses_ok, license_out);
		} else {
			er.turnWarningsIntoErrors();
			result = er.getLastFailure()->event_type;
			mergeLicenses(licenses_with_errors, license_out);
		}
	} else {
		er.turnWarningsIntoErrors();
		result = er.getLastFailure()->event_type;
		if (license_out != nullptr) {
			license_out->proprietary_data[0] = '\0';
			license_out->linked_to_pc = false;
			license_out->days_left = 0;
		}
	}
#ifndef NDEBUG
	const string evlog = er.to_string();
	LOG_DEBUG("License status %s", evlog.c_str());
#endif

	if (license_out != nullptr) {
		er.exportLastEvents(license_out->status, LCC_API_AUDIT_EVENT_NUM);
	}
	return result;
}